

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

lzham_compress_status_t
lzham::lzham_lib_compress_memory
          (lzham_compress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  ulong uVar1;
  undefined8 uVar2;
  lzcompressor *plVar3;
  bool bVar4;
  lzham_compress_status_t lVar5;
  int iVar6;
  lzcompressor *plVar7;
  lzcompressor *this;
  undefined8 extraout_RDX;
  ulong __n;
  undefined1 auVar8 [16];
  lzham_malloc_context malloc_context;
  lzcompressor *local_88;
  uint32 *local_80;
  lzham_uint8 *local_78;
  init_params local_70;
  
  if (pDst_len == (size_t *)0x0 || pParams == (lzham_compress_params *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (src_len >> 0x20 != 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pSrc_buf == (lzham_uint8 *)0x0 && src_len != 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  local_70.m_pTask_pool = (task_pool *)0x0;
  local_70.m_max_helper_threads = 0;
  local_70.m_compression_level = cCompressionLevelDefault;
  local_70.m_dict_size_log2 = 0x16;
  local_70.m_block_size = 0x80000;
  local_70.m_lzham_compress_flags = 0;
  local_70.m_pSeed_bytes = (void *)0x0;
  local_70.m_num_seed_bytes = 0;
  local_70.m_table_max_update_interval = 0;
  local_70.m_table_update_interval_slow_rate = 0;
  local_70.m_extreme_parsing_max_best_arrivals = 4;
  local_70.m_fast_bytes_override = 0;
  lVar5 = create_internal_init_params(&local_70,pParams);
  if (lVar5 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
    return lVar5;
  }
  local_78 = pDst_buf;
  auVar8 = lzham::lzham_create_malloc_context((lzham *)0x0,(uint)pParams);
  uVar2 = local_70._8_8_;
  malloc_context = auVar8._0_8_;
  lVar5 = LZHAM_COMP_STATUS_FAILED_INITIALIZING;
  if (local_70.m_max_helper_threads == 0) {
    local_88 = (lzcompressor *)0x0;
    plVar7 = local_88;
    plVar3 = (lzcompressor *)local_70.m_pTask_pool;
  }
  else {
    local_80 = pAdler32;
    plVar7 = (lzcompressor *)
             lzham_new<lzham::task_pool,void*>((lzham *)malloc_context,&malloc_context,auVar8._8_8_)
    ;
    this = (lzcompressor *)(uVar2 & 0xffffffff);
    iVar6 = task_pool::init((task_pool *)plVar7,(EVP_PKEY_CTX *)this);
    auVar8._8_8_ = extraout_RDX;
    auVar8._0_8_ = malloc_context;
    pAdler32 = local_80;
    plVar3 = plVar7;
    if ((char)iVar6 == '\0') goto LAB_00108531;
  }
  local_70.m_pTask_pool = (task_pool *)plVar3;
  local_88 = plVar7;
  malloc_context = auVar8._0_8_;
  this = lzham_new<lzham::lzcompressor,void*>((lzham *)malloc_context,&malloc_context,auVar8._8_8_);
  if (this == (lzcompressor *)0x0) {
    this = local_88;
    lzham_delete<lzham::task_pool>(malloc_context,(task_pool *)local_88);
  }
  else {
    iVar6 = lzcompressor::init(this,(EVP_PKEY_CTX *)&local_70);
    if ((char)iVar6 == '\0') {
      lzham_delete<lzham::task_pool>(malloc_context,(task_pool *)local_88);
      lzham_delete<lzham::lzcompressor>(malloc_context,this);
      lVar5 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
    }
    else if (((src_len == 0) ||
             (bVar4 = lzcompressor::put_bytes(this,pSrc_buf,(uint)src_len), bVar4)) &&
            (bVar4 = lzcompressor::put_bytes(this,(void *)0x0,0), plVar7 = local_88, bVar4)) {
      uVar1 = *pDst_len;
      *pDst_len = (ulong)(this->m_comp_buf).m_size;
      if (pAdler32 != (uint32 *)0x0) {
        *pAdler32 = this->m_src_adler32;
      }
      __n = (ulong)(this->m_comp_buf).m_size;
      if (uVar1 < __n) {
        lzham_delete<lzham::task_pool>(malloc_context,(task_pool *)local_88);
        lzham_delete<lzham::lzcompressor>(malloc_context,this);
        lVar5 = LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }
      else {
        memcpy(local_78,(this->m_comp_buf).m_p,__n);
        lzham_delete<lzham::task_pool>(malloc_context,(task_pool *)plVar7);
        lzham_delete<lzham::lzcompressor>(malloc_context,this);
        lVar5 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
      }
    }
    else {
      *pDst_len = 0;
      lzham_delete<lzham::task_pool>(malloc_context,(task_pool *)local_88);
      lzham_delete<lzham::lzcompressor>(malloc_context,this);
      lVar5 = LZHAM_COMP_STATUS_FAILED;
    }
  }
LAB_00108531:
  lzham::lzham_destroy_malloc_context((lzham *)malloc_context,this);
  return lVar5;
}

Assistant:

lzham_compress_status_t LZHAM_CDECL lzham_lib_compress_memory(const lzham_compress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if ((!pParams) || (!pDst_len))
      {
         LZHAM_LOG_ERROR(6019);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pSrc_buf)
         {
            LZHAM_LOG_ERROR(6020);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }

      if (sizeof(size_t) > sizeof(uint32))
      {
         if (src_len > cUINT32_MAX)
         {
            LZHAM_LOG_ERROR(6021);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }

      lzcompressor::init_params internal_params;
      lzham_compress_status_t status = create_internal_init_params(internal_params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
      {
         LZHAM_LOG_ERROR(6022);
         return status;
      }

      lzham_malloc_context malloc_context = lzham_create_malloc_context(0);

      task_pool *pTP = NULL;
      if (internal_params.m_max_helper_threads)
      {
         pTP = lzham_new<task_pool>(malloc_context, malloc_context);
         if (!pTP->init(internal_params.m_max_helper_threads))
         {
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6023);
            return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
         }

         internal_params.m_pTask_pool = pTP;
      }

      lzcompressor *pCompressor = lzham_new<lzcompressor>(malloc_context, malloc_context);
      if (!pCompressor)
      {
         lzham_delete(malloc_context, pTP);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6024);
         return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
      }

      if (!pCompressor->init(internal_params))
      {
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6025);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pCompressor->put_bytes(pSrc_buf, static_cast<uint32>(src_len)))
         {
            *pDst_len = 0;
            lzham_delete(malloc_context, pTP);
            lzham_delete(malloc_context, pCompressor);
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6026);
            return LZHAM_COMP_STATUS_FAILED;
         }
      }

      if (!pCompressor->put_bytes(NULL, 0))
      {
         *pDst_len = 0;
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6027);
         return LZHAM_COMP_STATUS_FAILED;
      }

      const byte_vec &comp_data = pCompressor->get_compressed_data();

      size_t dst_buf_size = *pDst_len;
      *pDst_len = comp_data.size();

      if (pAdler32)
         *pAdler32 = pCompressor->get_src_adler32();

      if (comp_data.size() > dst_buf_size)
      {
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6028);
         return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }

      memcpy(pDst_buf, comp_data.get_ptr(), comp_data.size());

      lzham_delete(malloc_context, pTP);
      lzham_delete(malloc_context, pCompressor);
      lzham_destroy_malloc_context(malloc_context);
      return LZHAM_COMP_STATUS_SUCCESS;
   }